

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,basic_string_view<char,_std::char_traits<char>_> *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_6)

{
  string_view format_00;
  string_view data;
  Arg *in_stack_fffffffffffffe68;
  string local_190;
  Arg local_170;
  Arg local_140;
  Arg local_110;
  Arg local_e0;
  Arg local_b0;
  Arg local_80;
  size_t local_50;
  char *pcStack_48;
  
  format_00._M_len = format._M_str;
  local_50 = arg->_M_len;
  pcStack_48 = arg->_M_str;
  local_80.piece_._M_str = (arg_1->_M_dataplus)._M_p;
  local_80.piece_._M_len = arg_1->_M_string_length;
  local_b0.piece_._M_str = (arg_2->_M_dataplus)._M_p;
  local_b0.piece_._M_len = arg_2->_M_string_length;
  local_e0.piece_._M_str = (arg_3->_M_dataplus)._M_p;
  local_e0.piece_._M_len = arg_3->_M_string_length;
  local_110.piece_._M_str = (arg_4->_M_dataplus)._M_p;
  local_110.piece_._M_len = arg_4->_M_string_length;
  local_140.piece_._M_str = (arg_5->_M_dataplus)._M_p;
  local_140.piece_._M_len = arg_5->_M_string_length;
  local_170.piece_._M_str = (arg_6->_M_dataplus)._M_p;
  local_170.piece_._M_len = arg_6->_M_string_length;
  format_00._M_str = (char *)&local_50;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_190,(lts_20250127 *)format._M_len,format_00,&local_80,&local_b0,&local_e0,
             &local_110,&local_140,&local_170,in_stack_fffffffffffffe68);
  data._M_str = local_190._M_dataplus._M_p;
  data._M_len = local_190._M_string_length;
  Write(this,data);
  std::__cxx11::string::~string((string *)&local_190);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }